

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpDef.cpp
# Opt level: O1

void __thiscall Liby::http::RequestParser::clear(RequestParser *this)

{
  this->progress_ = 1;
  this->bytes_ = 0;
  (this->super_Request).method_ = 0;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_Request).query_,0,
             (char *)(this->super_Request).query_._M_string_length,0x13c1ff);
  std::__cxx11::string::_M_assign((string *)&(this->super_Request).uri_);
  this->http_version_major_ = 0;
  this->http_version_minor_ = 0;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::clear(&(this->super_Request).headers_._M_h);
  return;
}

Assistant:

void RequestParser::clear() {
    progress_ = ParsingMethod;
    bytes_ = 0;
    method_ = INVALID_METHOD;
    uri_ = query_ = "";
    http_version_major_ = http_version_minor_ = 0;
    headers_.clear();
}